

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
vkt::shaderexecutor::Functions::Div::applyPoint
          (Interval *__return_storage_ptr__,Div *this,EvalContext *ctx,double x,double y)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  Interval local_a0;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  undefined1 local_40 [8];
  Interval dst;
  double y_local;
  double x_local;
  EvalContext *ctx_local;
  Div *this_local;
  
  dst.m_hi = y;
  FloatFunc2::applyPoint(__return_storage_ptr__,(FloatFunc2 *)this,ctx,x,y);
  iVar2 = deIsInf(x);
  if (((iVar2 == 0) && (iVar2 = deIsInf(dst.m_hi), iVar2 == 0)) &&
     ((dst.m_hi != 0.0 || (NAN(dst.m_hi))))) {
    tcu::FloatFormat::convert((Interval *)local_40,&ctx->format,__return_storage_ptr__);
    fVar3 = std::numeric_limits<float>::infinity();
    tcu::Interval::Interval(&local_58,(double)-fVar3);
    bVar1 = tcu::Interval::contains((Interval *)local_40,&local_58);
    if (bVar1) {
      dVar4 = tcu::FloatFormat::getMaxValue(&ctx->format);
      tcu::Interval::Interval(&local_70,-dVar4);
      tcu::Interval::operator|=(__return_storage_ptr__,&local_70);
    }
    fVar3 = std::numeric_limits<float>::infinity();
    tcu::Interval::Interval(&local_88,(double)fVar3);
    bVar1 = tcu::Interval::contains((Interval *)local_40,&local_88);
    if (bVar1) {
      dVar4 = tcu::FloatFormat::getMaxValue(&ctx->format);
      tcu::Interval::Interval(&local_a0,dVar4);
      tcu::Interval::operator|=(__return_storage_ptr__,&local_a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint		(const EvalContext&	ctx, double x, double y) const
	{
		Interval ret = FloatFunc2::applyPoint(ctx, x, y);

		if (!deIsInf(x) && !deIsInf(y) && y != 0.0)
		{
			const Interval dst = ctx.format.convert(ret);
			if (dst.contains(-TCU_INFINITY)) ret |= -ctx.format.getMaxValue();
			if (dst.contains(+TCU_INFINITY)) ret |= +ctx.format.getMaxValue();
		}

		return ret;
	}